

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

bool __thiscall QBoxLayout::setStretchFactor(QBoxLayout *this,QLayout *layout,int stretch)

{
  long lVar1;
  QLayout *pQVar2;
  ulong uVar3;
  undefined8 *puVar4;
  bool bVar5;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  bVar5 = *(long *)(lVar1 + 0xc0) != 0;
  if (bVar5) {
    puVar4 = (undefined8 *)**(undefined8 **)(lVar1 + 0xb8);
    pQVar2 = (QLayout *)(**(code **)(*(long *)*puVar4 + 0x70))();
    if (pQVar2 != layout) {
      uVar3 = 1;
      do {
        bVar5 = uVar3 < *(ulong *)(lVar1 + 0xc0);
        if (*(ulong *)(lVar1 + 0xc0) <= uVar3) {
          return bVar5;
        }
        puVar4 = *(undefined8 **)(*(long *)(lVar1 + 0xb8) + uVar3 * 8);
        pQVar2 = (QLayout *)(**(code **)(*(long *)*puVar4 + 0x70))();
        uVar3 = uVar3 + 1;
      } while (pQVar2 != layout);
    }
    if (*(int *)(puVar4 + 1) != stretch) {
      *(int *)(puVar4 + 1) = stretch;
      (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    }
  }
  return bVar5;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }